

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall
chrono::robosimian::RS_Limb::GetMotorActuations
          (RS_Limb *this,array<double,_8UL> *angles,array<double,_8UL> *speeds)

{
  mapped_type *pmVar1;
  undefined1 *__k;
  long lVar2;
  double dVar3;
  shared_ptr<chrono::ChFunction_Setpoint> fun;
  shared_ptr<chrono::ChFunction> local_50;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  __k = motor_names_abi_cxx11_;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    pmVar1 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->m_motors,(key_type *)__k);
    std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)
               ((pmVar1->super___shared_ptr<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr + 0x250));
    std::static_pointer_cast<chrono::ChFunction_Setpoint,chrono::ChFunction>(&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    dVar3 = (double)(**(code **)(*(long *)local_50.
                                          super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x20))(0);
    angles->_M_elems[lVar2] = dVar3;
    dVar3 = (double)(**(code **)(*(long *)local_50.
                                          super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x28))(0);
    speeds->_M_elems[lVar2] = dVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    __k = (undefined1 *)((long)__k + 0x20);
  }
  return;
}

Assistant:

void RS_Limb::GetMotorActuations(std::array<double, 8>& angles, std::array<double, 8>& speeds) {
    for (int i = 0; i < 8; i++) {
        auto fun = std::static_pointer_cast<ChFunction_Setpoint>(m_motors[motor_names[i]]->GetMotorFunction());
        // Note: the time passed as argument here does not matter for a Chfunction_Setpoint
        angles[i] = fun->Get_y(0);
        speeds[i] = fun->Get_y_dx(0);
    }
}